

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_property.c
# Opt level: O2

int mpt_graph_set(mpt_graph *gr,char *name,mpt_convertable *src)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  mpt_graph *in_RAX;
  mpt_color *pmVar4;
  mpt_graph *from;
  
  from = in_RAX;
  if (name == (char *)0x0) {
    if (src == (mpt_convertable *)0x0) {
      return -4;
    }
    iVar2 = mpt_graph_pointer_typeid();
    if ((0 < iVar2) && (iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,&from), -1 < iVar2)) {
      mpt_graph_fini(gr);
      if (iVar2 == 0) {
        from = (mpt_graph *)0x0;
      }
      mpt_graph_init(gr,from);
      return 0;
    }
    iVar2 = mpt_color_typeid();
    if (iVar2 < 1) {
      return -3;
    }
    pmVar4 = &gr->fg;
    iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,pmVar4);
    if (-1 < iVar2) {
      if (iVar2 == 0) {
        pmVar4->alpha = 0xff;
        pmVar4->red = '\0';
        pmVar4->green = '\0';
        pmVar4->blue = '\0';
        return 0;
      }
      return 0;
    }
    return -3;
  }
  cVar1 = *name;
  if (cVar1 == 'f') {
    if ((name[1] != 'g') || (name[2] != '\0')) goto LAB_001064cb;
  }
  else {
    if (cVar1 == '\0') {
      if (src == (mpt_convertable *)0x0) {
        mpt_graph_fini(gr);
        return 0;
      }
      iVar2 = mpt_graph_pointer_typeid();
      if (0 < iVar2) {
        iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,&from);
        if (-1 < iVar2) {
          mpt_graph_fini(gr);
          mpt_graph_init(gr,from);
          return (uint)(iVar2 != 0);
        }
        return -3;
      }
      return -3;
    }
LAB_001064cb:
    iVar2 = strcasecmp(name,"foreground");
    if (iVar2 != 0) {
      if ((((cVar1 != 'b') || (name[1] != 'g')) || (name[2] != '\0')) &&
         (iVar2 = strcasecmp(name,"background"), iVar2 != 0)) {
        iVar2 = strcmp(name,"pos");
        if ((iVar2 == 0) || (iVar2 = strcasecmp(name,"position"), iVar2 == 0)) {
          if ((src == (mpt_convertable *)0x0) ||
             (uVar3 = mpt_fpoint_set(&gr->pos,src,&mpt_graph_set::r), uVar3 == 0)) {
            (gr->pos).x = 0.0;
            (gr->pos).y = 0.0;
            return 0;
          }
        }
        else {
          iVar2 = strcasecmp(name,"scale");
          if (iVar2 == 0) {
            if ((src != (mpt_convertable *)0x0) &&
               (iVar2 = mpt_fpoint_set(&gr->scale,src,&mpt_graph_set::r_1), iVar2 != 0)) {
              return iVar2;
            }
            (gr->scale).x = 1.0;
            (gr->scale).y = 1.0;
            return 0;
          }
          iVar2 = strcmp(name,"type");
          if ((iVar2 == 0) || (iVar2 = strcasecmp(name,"gridtype"), iVar2 == 0)) {
            if ((src == (mpt_convertable *)0x0) ||
               (uVar3 = (*src->_vptr->convert)(src,99,&gr->grid), uVar3 == 0)) {
              gr->grid = '\0';
              return 0;
            }
          }
          else {
            iVar2 = strcmp(name,"align");
            if ((iVar2 == 0) || (iVar2 = strcasecmp(name,"alignment"), iVar2 == 0)) {
              if ((src != (mpt_convertable *)0x0) &&
                 (iVar2 = (*src->_vptr->convert)(src,0x79,&gr->align), iVar2 != 0)) {
                return 0;
              }
              gr->align = '\0';
              return 0;
            }
            iVar2 = strcmp(name,"clip");
            if ((iVar2 == 0) || (iVar2 = strcasecmp(name,"clipping"), iVar2 == 0)) {
              if ((src != (mpt_convertable *)0x0) &&
                 (iVar2 = (*src->_vptr->convert)(src,0x79,&gr->clip), iVar2 != 0)) {
                return 0;
              }
              gr->clip = '\0';
              return 0;
            }
            iVar2 = strcmp(name,"lpos");
            if (iVar2 != 0) {
              iVar2 = strcmp(name,"axes");
              if (iVar2 != 0) {
                iVar2 = strcmp(name,"worlds");
                if (iVar2 != 0) {
                  return -1;
                }
                gr = (mpt_graph *)&gr->_worlds;
              }
              if (src != (mpt_convertable *)0x0) {
                iVar2 = mpt_string_pset(&gr->_axes,src);
                return iVar2;
              }
              mpt_string_set(&gr->_axes,(char *)0x0,0);
              return 0;
            }
            if ((src == (mpt_convertable *)0x0) ||
               (uVar3 = (*src->_vptr->convert)(src,99,&gr->lpos), uVar3 == 0)) {
              gr->lpos = '\0';
              return 0;
            }
          }
        }
        return (int)uVar3 >> 0x1f & uVar3;
      }
      pmVar4 = &gr->bg;
      if (src == (mpt_convertable *)0x0) {
        pmVar4->alpha = '\0';
        pmVar4->red = 0xff;
        pmVar4->green = 0xff;
        pmVar4->blue = 0xff;
        return 0;
      }
      goto LAB_0010668f;
    }
  }
  pmVar4 = &gr->fg;
  if (src == (mpt_convertable *)0x0) {
    pmVar4->alpha = 0xff;
    pmVar4->red = '\0';
    pmVar4->green = '\0';
    pmVar4->blue = '\0';
    return 0;
  }
LAB_0010668f:
  iVar2 = mpt_color_pset(pmVar4,src);
  return iVar2;
}

Assistant:

extern int mpt_graph_set(MPT_STRUCT(graph) *gr, const char *name, MPT_INTERFACE(convertable) *src)
{
	int len;
	
	/* auto-select matching property */
	if (!name) {
		const MPT_STRUCT(graph) *from;
		int type;
		
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((type = mpt_graph_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_graph_fini(gr);
			mpt_graph_init(gr, len ? from : 0);
			return 0;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &gr->fg)) >= 0) {
			if (!len) gr->fg = def_graph.fg;
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		const MPT_STRUCT(graph) *from;
		int type;
		
		if (!src) {
			mpt_graph_fini(gr);
			return 0;
		}
		if ((type = mpt_graph_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_graph_fini(gr);
			mpt_graph_init(gr, from);
			return len <= 0 ? len : 1;
		}
		return MPT_ERROR(BadType);
	}
	if (!strcmp(name, "fg") || !strcasecmp(name, "foreground")) {
		if (!src) {
			gr->fg = def_graph.fg;
			return 0;
		}
		return mpt_color_pset(&gr->fg, src);
	}
	if (!strcmp(name, "bg") || !strcasecmp(name, "background")) {
		if (!src) {
			gr->bg = def_graph.bg;
			return 0;
		}
		return mpt_color_pset(&gr->bg, src);
	}
	if (!strcmp(name, "pos") || !strcasecmp(name, "position")) {
		static const MPT_STRUCT(range) r = { 0.0, 1.0 };
		if (!src || !(len = mpt_fpoint_set(&gr->pos, src, &r))) {
			gr->pos = def_graph.pos;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "scale")) {
		static const MPT_STRUCT(range) r = { 0.0, FLT_MAX };
		if (!src || !(len = mpt_fpoint_set(&gr->scale, src, &r))) {
			gr->scale = def_graph.scale;
			return 0;
		}
		return len;
	}
	if (!strcmp(name, "type") || !strcasecmp(name, "gridtype")) {
		if (!src || !(len = src->_vptr->convert(src, 'c', &gr->grid))) {
			gr->grid = def_graph.grid;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcmp(name, "align") || !strcasecmp(name, "alignment")) {
		const char *v;
		uint8_t n = 0;
		int i = 0;
		
		if (!src || !(len = src->_vptr->convert(src, 'y', &gr->align))) {
			gr->align = def_graph.align;
			return 0;
		}
		if (len) {
			return 0;
		}
		if ((len = src->_vptr->convert(src, 's', &v)) < 0) {
			return len;
		}
		if (!len || !v) {
			n = 0;
		}
		else while (v[i]) {
			if (i >= 4) {
				break;
			}
			switch (v[i++]) {
			  case 0: len = i - 1; break;
			  case 'B': case 'b': n |= MPT_ENUM(AlignBegin) << i*2; break;
			  case 'E': case 'e': n |= MPT_ENUM(AlignEnd)   << i*2; break;
			  case 'Z': case 'z': n |= MPT_ENUM(AlignZero)  << i*2; break;
			  default:;
			}
		}
		gr->align = n;
		
		return 0;
	}
	if (!strcmp(name, "clip") || !strcasecmp(name, "clipping")) {
		const char *v;
		uint8_t n = 0;
		
		if (!src || !(len = src->_vptr->convert(src, 'y', &gr->clip))) {
			gr->clip = def_graph.clip;
			return 0;
		}
		if (len) {
			return 0;
		}
		if ((len = src->_vptr->convert(src, 's', &v)) < 0) {
			return len;
		}
		if (!len || !v) {
			gr->clip = def_graph.clip;
			return 0;
		}
		while (*v) {
			switch (*v++) {
			  case 'x': n |= 1; break;
			  case 'y': n |= 2; break;
			  case 'z': n |= 4; break;
			  default:  n |= 8;
			}
		}
		gr->clip = n;
		return 0;
	}
	if (!strcmp(name, "lpos")) {
		if (!src || !(len = src->_vptr->convert(src, 'c', &gr->lpos))) {
			gr->lpos = def_graph.lpos;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcmp(name, "axes")) {
		if (!src) {
			mpt_string_set(&gr->_axes, 0, 0);
			return 0;
		}
		return mpt_string_pset(&gr->_axes, src);
	}
	if (!strcmp(name, "worlds")) {
		if (!src) {
			mpt_string_set(&gr->_worlds, 0, 0);
			return 0;
		}
		return mpt_string_pset(&gr->_worlds, src);
	}
	return MPT_ERROR(BadArgument);
}